

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

void ReadArray<aiVertexWeight>(IOStream *stream,aiVertexWeight *out,uint size)

{
  aiVertexWeight aVar1;
  uint local_20;
  uint i;
  uint size_local;
  aiVertexWeight *out_local;
  IOStream *stream_local;
  
  if (stream == (IOStream *)0x0) {
    __assert_fail("nullptr != stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Assbin/AssbinLoader.cpp"
                  ,0xc6,"void ReadArray(IOStream *, T *, unsigned int) [T = aiVertexWeight]");
  }
  if (out != (aiVertexWeight *)0x0) {
    for (local_20 = 0; local_20 < size; local_20 = local_20 + 1) {
      aVar1 = Read<aiVertexWeight>(stream);
      out[local_20] = aVar1;
    }
    return;
  }
  __assert_fail("nullptr != out",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Assbin/AssbinLoader.cpp"
                ,199,"void ReadArray(IOStream *, T *, unsigned int) [T = aiVertexWeight]");
}

Assistant:

void ReadArray( IOStream *stream, T * out, unsigned int size) {
    ai_assert( nullptr != stream );
    ai_assert( nullptr != out );

    for (unsigned int i=0; i<size; i++) {
        out[i] = Read<T>(stream);
    }
}